

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.hpp
# Opt level: O0

void __thiscall soplex::SLUFactorRational::freeAll(SLUFactorRational *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0xc0) != 0) {
    spx_free<int*>((int **)0x1bee76);
  }
  if (*(long *)(in_RDI + 0xb8) != 0) {
    spx_free<int*>((int **)0x1bee9a);
  }
  if (*(long *)(in_RDI + 0xd0) != 0) {
    spx_free<int*>((int **)0x1beec2);
  }
  if (*(long *)(in_RDI + 200) != 0) {
    spx_free<int*>((int **)0x1beee6);
  }
  if (*(long *)(in_RDI + 0x188) != 0) {
    spx_free<soplex::CLUFactorRational::Dring*>((Dring **)0x1bef0e);
  }
  if (*(long *)(in_RDI + 0x1b0) != 0) {
    spx_free<int*>((int **)0x1bef36);
  }
  if (*(long *)(in_RDI + 0x1b8) != 0) {
    spx_free<int*>((int **)0x1bef5e);
  }
  if (*(long *)(in_RDI + 0x1c0) != 0) {
    spx_free<int*>((int **)0x1bef86);
  }
  if (*(long *)(in_RDI + 0x1c8) != 0) {
    spx_free<int*>((int **)0x1befae);
  }
  if (*(long *)(in_RDI + 0x1e8) != 0) {
    spx_free<soplex::CLUFactorRational::Dring*>((Dring **)0x1befda);
  }
  if (*(long *)(in_RDI + 0x1f8) != 0) {
    spx_free<int*>((int **)0x1bf006);
  }
  if (*(long *)(in_RDI + 0x218) != 0) {
    spx_free<int*>((int **)0x1bf032);
  }
  if (*(long *)(in_RDI + 0x220) != 0) {
    spx_free<int*>((int **)0x1bf05e);
  }
  if (*(long *)(in_RDI + 0x228) != 0) {
    spx_free<int*>((int **)0x1bf08a);
  }
  if (*(long *)(in_RDI + 0xf0) != 0) {
    spx_free<int*>((int **)0x1bf0b2);
  }
  if (*(long *)(in_RDI + 0x108) != 0) {
    spx_free<int*>((int **)0x1bf0da);
  }
  if (*(long *)(in_RDI + 0x110) != 0) {
    spx_free<int*>((int **)0x1bf102);
  }
  if (*(long *)(in_RDI + 0x138) != 0) {
    spx_free<int*>((int **)0x1bf12a);
  }
  if (*(long *)(in_RDI + 0x140) != 0) {
    spx_free<int*>((int **)0x1bf152);
  }
  if (*(long *)(in_RDI + 0x148) != 0) {
    spx_free<int*>((int **)0x1bf17a);
  }
  if (*(long *)(in_RDI + 0x150) != 0) {
    spx_free<int*>((int **)0x1bf1a2);
  }
  spx_free<soplex::Timer*>((Timer **)0x1bf1b3);
  spx_free<soplex::Timer*>((Timer **)0x1bf1c8);
  return;
}

Assistant:

inline void SLUFactorRational::freeAll()
{

   if(row.perm)
      spx_free(row.perm);

   if(row.orig)
      spx_free(row.orig);

   if(col.perm)
      spx_free(col.perm);

   if(col.orig)
      spx_free(col.orig);

   if(u.row.elem)
      spx_free(u.row.elem);

   if(u.row.idx)
      spx_free(u.row.idx);

   if(u.row.start)
      spx_free(u.row.start);

   if(u.row.len)
      spx_free(u.row.len);

   if(u.row.max)
      spx_free(u.row.max);

   if(u.col.elem)
      spx_free(u.col.elem);

   if(u.col.idx)
      spx_free(u.col.idx);

   if(u.col.start)
      spx_free(u.col.start);

   if(u.col.len)
      spx_free(u.col.len);

   if(u.col.max)
      spx_free(u.col.max);

   if(l.idx)
      spx_free(l.idx);

   if(l.start)
      spx_free(l.start);

   if(l.row)
      spx_free(l.row);

   if(l.ridx)
      spx_free(l.ridx);

   if(l.rbeg)
      spx_free(l.rbeg);

   if(l.rorig)
      spx_free(l.rorig);

   if(l.rperm)
      spx_free(l.rperm);

   spx_free(solveTime);
   spx_free(factorTime);
}